

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_crg(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  OPJ_UINT32 OVar1;
  
  cio = j2k->cio;
  OVar1 = j2k->image->numcomps;
  cio_read(cio,2);
  if (0 < (int)OVar1) {
    do {
      cio_read(cio,2);
      cio_read(cio,2);
      OVar1 = OVar1 - 1;
    } while (OVar1 != 0);
  }
  return;
}

Assistant:

static void j2k_read_crg(opj_j2k_t *j2k) {
	int len, i, Xcrg_i, Ycrg_i;
	
	opj_cio_t *cio = j2k->cio;
	int numcomps = j2k->image->numcomps;
	
	len = cio_read(cio, 2);			/* Lcrg */
	for (i = 0; i < numcomps; i++) {
		Xcrg_i = cio_read(cio, 2);	/* Xcrg_i */
		Ycrg_i = cio_read(cio, 2);	/* Ycrg_i */
	}
}